

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketHeader.cpp
# Opt level: O2

void __thiscall ki::protocol::net::PacketHeader::read_from(PacketHeader *this,istream *istream)

{
  uint8_t uVar1;
  int iVar2;
  parse_error *ppVar3;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  iVar2 = std::istream::get();
  this->m_control = 0 < iVar2;
  if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 5) != 0) {
    ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string
              ((string *)&local_38,
               "Not enough data was available to read packet header. (m_control)",&local_79);
    parse_error::parse_error(ppVar3,&local_38,INVALID_HEADER_DATA);
    __cxa_throw(ppVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = std::istream::get();
  this->m_opcode = uVar1;
  if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 5) == 0) {
    std::istream::ignore((long)istream);
    if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 2) == 0) {
      return;
    }
    ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string
              ((string *)&local_78,
               "Not enough data was available to read packet header. (ignored bytes)",&local_79);
    parse_error::parse_error(ppVar3,&local_78,INVALID_HEADER_DATA);
    __cxa_throw(ppVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string
            ((string *)&local_58,"Not enough data was available to read packet header. (m_opcode)",
             &local_79);
  parse_error::parse_error(ppVar3,&local_58,INVALID_HEADER_DATA);
  __cxa_throw(ppVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PacketHeader::read_from(std::istream& istream)
	{
		m_control = istream.get() >= 1;
		if (istream.fail())
			throw parse_error("Not enough data was available to read packet header. (m_control)",
				parse_error::INVALID_HEADER_DATA);
		m_opcode = istream.get();
		if (istream.fail())
			throw parse_error("Not enough data was available to read packet header. (m_opcode)",
				parse_error::INVALID_HEADER_DATA);
		istream.ignore(2);
		if (istream.eof())
			throw parse_error("Not enough data was available to read packet header. (ignored bytes)",
				parse_error::INVALID_HEADER_DATA);
	}